

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_setup_encoder
                   (opj_jp2_t *jp2,opj_cparameters_t *parameters,opj_image_t *image,
                   opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_BOOL OVar2;
  int iVar3;
  OPJ_UINT32 *pOVar4;
  opj_jp2_comps_t *poVar5;
  opj_jp2_cdef_t *poVar6;
  opj_jp2_cdef_info_t *poVar7;
  uint local_48;
  OPJ_UINT32 depth;
  OPJ_UINT32 alpha_channel;
  OPJ_UINT32 color_channels;
  OPJ_UINT32 alpha_count;
  OPJ_UINT32 sign;
  OPJ_UINT32 depth_0;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  opj_image_t *image_local;
  opj_cparameters_t *parameters_local;
  opj_jp2_t *jp2_local;
  
  depth = 0;
  local_48 = 0;
  if (((jp2 == (opj_jp2_t *)0x0) || (parameters == (opj_cparameters_t *)0x0)) ||
     (image == (opj_image_t *)0x0)) {
    return 0;
  }
  if ((image->numcomps == 0) || (0x4000 < image->numcomps)) {
    opj_event_msg(p_manager,1,
                  "Invalid number of components specified while setting up JP2 encoder\n");
    return 0;
  }
  OVar2 = opj_j2k_setup_encoder(jp2->j2k,parameters,image,p_manager);
  if (OVar2 == 0) {
    return 0;
  }
  jp2->brand = 0x6a703220;
  jp2->minversion = 0;
  jp2->numcl = 1;
  pOVar4 = (OPJ_UINT32 *)opj_malloc((ulong)jp2->numcl << 2);
  jp2->cl = pOVar4;
  if (jp2->cl == (OPJ_UINT32 *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory when setup the JP2 encoder\n");
    return 0;
  }
  *jp2->cl = 0x6a703220;
  jp2->numcomps = image->numcomps;
  poVar5 = (opj_jp2_comps_t *)opj_malloc((ulong)jp2->numcomps * 0xc);
  jp2->comps = poVar5;
  if (jp2->comps == (opj_jp2_comps_t *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory when setup the JP2 encoder\n");
    return 0;
  }
  jp2->h = image->y1 - image->y0;
  jp2->w = image->x1 - image->x0;
  iVar3 = image->comps->prec - 1;
  jp2->bpc = iVar3 + image->comps->sgnd * 0x80;
  for (sign = 1; sign < image->numcomps; sign = sign + 1) {
    if (iVar3 != image->comps[sign].prec - 1) {
      jp2->bpc = 0xff;
    }
  }
  jp2->C = 7;
  jp2->UnkC = 0;
  jp2->IPR = 0;
  for (sign = 0; sign < image->numcomps; sign = sign + 1) {
    jp2->comps[sign].bpcc = (image->comps[sign].prec - 1) + image->comps[sign].sgnd * 0x80;
  }
  if (image->icc_profile_len == 0) {
    jp2->meth = 1;
    if (image->color_space == OPJ_CLRSPC_SRGB) {
      jp2->enumcs = 0x10;
    }
    else if (image->color_space == OPJ_CLRSPC_GRAY) {
      jp2->enumcs = 0x11;
    }
    else if (image->color_space == OPJ_CLRSPC_SYCC) {
      jp2->enumcs = 0x12;
    }
  }
  else {
    jp2->meth = 2;
    jp2->enumcs = 0;
  }
  alpha_channel = 0;
  for (sign = 0; sign < image->numcomps; sign = sign + 1) {
    if (image->comps[sign].alpha != 0) {
      alpha_channel = alpha_channel + 1;
      local_48 = sign;
    }
  }
  if (alpha_channel != 1) {
    if (1 < alpha_channel) {
      opj_event_msg(p_manager,2,"Multiple alpha channels specified. No cdef box will be created.\n")
      ;
    }
    goto LAB_0012e04b;
  }
  OVar1 = jp2->enumcs;
  if (OVar1 == 0x10) {
LAB_0012df97:
    depth = 3;
  }
  else if (OVar1 == 0x11) {
    depth = 1;
  }
  else {
    if (OVar1 == 0x12) goto LAB_0012df97;
    alpha_channel = 0;
  }
  if (alpha_channel == 0) {
    opj_event_msg(p_manager,2,
                  "Alpha channel specified but unknown enumcs. No cdef box will be created.\n");
  }
  else if (image->numcomps < depth + 1) {
    opj_event_msg(p_manager,2,
                  "Alpha channel specified but not enough image components for an automatic cdef box creation.\n"
                 );
    alpha_channel = 0;
  }
  else if (local_48 < depth) {
    opj_event_msg(p_manager,2,
                  "Alpha channel position conflicts with color channel. No cdef box will be created.\n"
                 );
    alpha_channel = 0;
  }
LAB_0012e04b:
  if (alpha_channel == 1) {
    poVar6 = (opj_jp2_cdef_t *)opj_malloc(0x10);
    (jp2->color).jp2_cdef = poVar6;
    if ((jp2->color).jp2_cdef == (opj_jp2_cdef_t *)0x0) {
      opj_event_msg(p_manager,1,"Not enough memory to setup the JP2 encoder\n");
      return 0;
    }
    poVar7 = (opj_jp2_cdef_info_t *)opj_malloc((ulong)image->numcomps * 6);
    ((jp2->color).jp2_cdef)->info = poVar7;
    if (((jp2->color).jp2_cdef)->info == (opj_jp2_cdef_info_t *)0x0) {
      opj_event_msg(p_manager,1,"Not enough memory to setup the JP2 encoder\n");
      return 0;
    }
    ((jp2->color).jp2_cdef)->n = (OPJ_UINT16)image->numcomps;
    for (sign = 0; sign < depth; sign = sign + 1) {
      ((jp2->color).jp2_cdef)->info[sign].cn = (OPJ_UINT16)sign;
      ((jp2->color).jp2_cdef)->info[sign].typ = 0;
      ((jp2->color).jp2_cdef)->info[sign].asoc = (OPJ_UINT16)sign + 1;
    }
    for (; sign < image->numcomps; sign = sign + 1) {
      if (image->comps[sign].alpha == 0) {
        ((jp2->color).jp2_cdef)->info[sign].cn = (OPJ_UINT16)sign;
        ((jp2->color).jp2_cdef)->info[sign].typ = 0xffff;
        ((jp2->color).jp2_cdef)->info[sign].asoc = 0xffff;
      }
      else {
        ((jp2->color).jp2_cdef)->info[sign].cn = (OPJ_UINT16)sign;
        ((jp2->color).jp2_cdef)->info[sign].typ = 1;
        ((jp2->color).jp2_cdef)->info[sign].asoc = 0;
      }
    }
  }
  jp2->precedence = 0;
  jp2->approx = 0;
  jp2->jpip_on = parameters->jpip_on;
  return 1;
}

Assistant:

OPJ_BOOL opj_jp2_setup_encoder(opj_jp2_t *jp2,
                               opj_cparameters_t *parameters,
                               opj_image_t *image,
                               opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_UINT32 depth_0;
    OPJ_UINT32 sign;
    OPJ_UINT32 alpha_count;
    OPJ_UINT32 color_channels = 0U;
    OPJ_UINT32 alpha_channel = 0U;


    if (!jp2 || !parameters || !image) {
        return OPJ_FALSE;
    }

    /* setup the J2K codec */
    /* ------------------- */

    /* Check if number of components respects standard */
    if (image->numcomps < 1 || image->numcomps > 16384) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid number of components specified while setting up JP2 encoder\n");
        return OPJ_FALSE;
    }

    if (opj_j2k_setup_encoder(jp2->j2k, parameters, image,
                              p_manager) == OPJ_FALSE) {
        return OPJ_FALSE;
    }

    /* setup the JP2 codec */
    /* ------------------- */

    /* Profile box */

    jp2->brand = JP2_JP2;   /* BR */
    jp2->minversion = 0;    /* MinV */
    jp2->numcl = 1;
    jp2->cl = (OPJ_UINT32*) opj_malloc(jp2->numcl * sizeof(OPJ_UINT32));
    if (!jp2->cl) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory when setup the JP2 encoder\n");
        return OPJ_FALSE;
    }
    jp2->cl[0] = JP2_JP2;   /* CL0 : JP2 */

    /* Image Header box */

    jp2->numcomps = image->numcomps;    /* NC */
    jp2->comps = (opj_jp2_comps_t*) opj_malloc(jp2->numcomps * sizeof(
                     opj_jp2_comps_t));
    if (!jp2->comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory when setup the JP2 encoder\n");
        /* Memory of jp2->cl will be freed by opj_jp2_destroy */
        return OPJ_FALSE;
    }

    jp2->h = image->y1 - image->y0;     /* HEIGHT */
    jp2->w = image->x1 - image->x0;     /* WIDTH */
    /* BPC */
    depth_0 = image->comps[0].prec - 1;
    sign = image->comps[0].sgnd;
    jp2->bpc = depth_0 + (sign << 7);
    for (i = 1; i < image->numcomps; i++) {
        OPJ_UINT32 depth = image->comps[i].prec - 1;
        sign = image->comps[i].sgnd;
        if (depth_0 != depth) {
            jp2->bpc = 255;
        }
    }
    jp2->C = 7;         /* C : Always 7 */
    jp2->UnkC = 0;      /* UnkC, colorspace specified in colr box */
    jp2->IPR = 0;       /* IPR, no intellectual property */

    /* BitsPerComponent box */
    for (i = 0; i < image->numcomps; i++) {
        jp2->comps[i].bpcc = image->comps[i].prec - 1 + (image->comps[i].sgnd << 7);
    }

    /* Colour Specification box */
    if (image->icc_profile_len) {
        jp2->meth = 2;
        jp2->enumcs = 0;
    } else {
        jp2->meth = 1;
        if (image->color_space == 1) {
            jp2->enumcs = 16;    /* sRGB as defined by IEC 61966-2-1 */
        } else if (image->color_space == 2) {
            jp2->enumcs = 17;    /* greyscale */
        } else if (image->color_space == 3) {
            jp2->enumcs = 18;    /* YUV */
        }
    }

    /* Channel Definition box */
    /* FIXME not provided by parameters */
    /* We try to do what we can... */
    alpha_count = 0U;
    for (i = 0; i < image->numcomps; i++) {
        if (image->comps[i].alpha != 0) {
            alpha_count++;
            alpha_channel = i;
        }
    }
    if (alpha_count == 1U) { /* no way to deal with more than 1 alpha channel */
        switch (jp2->enumcs) {
        case 16:
        case 18:
            color_channels = 3;
            break;
        case 17:
            color_channels = 1;
            break;
        default:
            alpha_count = 0U;
            break;
        }
        if (alpha_count == 0U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel specified but unknown enumcs. No cdef box will be created.\n");
        } else if (image->numcomps < (color_channels + 1)) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel specified but not enough image components for an automatic cdef box creation.\n");
            alpha_count = 0U;
        } else if ((OPJ_UINT32)alpha_channel < color_channels) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Alpha channel position conflicts with color channel. No cdef box will be created.\n");
            alpha_count = 0U;
        }
    } else if (alpha_count > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Multiple alpha channels specified. No cdef box will be created.\n");
    }
    if (alpha_count == 1U) { /* if here, we know what we can do */
        jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
        if (!jp2->color.jp2_cdef) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to setup the JP2 encoder\n");
            return OPJ_FALSE;
        }
        /* no memset needed, all values will be overwritten except if jp2->color.jp2_cdef->info allocation fails, */
        /* in which case jp2->color.jp2_cdef->info will be NULL => valid for destruction */
        jp2->color.jp2_cdef->info = (opj_jp2_cdef_info_t*) opj_malloc(
                                        image->numcomps * sizeof(opj_jp2_cdef_info_t));
        if (!jp2->color.jp2_cdef->info) {
            /* memory will be freed by opj_jp2_destroy */
            opj_event_msg(p_manager, EVT_ERROR,
                          "Not enough memory to setup the JP2 encoder\n");
            return OPJ_FALSE;
        }
        jp2->color.jp2_cdef->n = (OPJ_UINT16)
                                 image->numcomps; /* cast is valid : image->numcomps [1,16384] */
        for (i = 0U; i < color_channels; i++) {
            jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                              i; /* cast is valid : image->numcomps [1,16384] */
            jp2->color.jp2_cdef->info[i].typ = 0U;
            jp2->color.jp2_cdef->info[i].asoc = (OPJ_UINT16)(i +
                                                1U); /* No overflow + cast is valid : image->numcomps [1,16384] */
        }
        for (; i < image->numcomps; i++) {
            if (image->comps[i].alpha != 0) { /* we'll be here exactly once */
                jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                                  i; /* cast is valid : image->numcomps [1,16384] */
                jp2->color.jp2_cdef->info[i].typ = 1U; /* Opacity channel */
                jp2->color.jp2_cdef->info[i].asoc =
                    0U; /* Apply alpha channel to the whole image */
            } else {
                /* Unknown channel */
                jp2->color.jp2_cdef->info[i].cn = (OPJ_UINT16)
                                                  i; /* cast is valid : image->numcomps [1,16384] */
                jp2->color.jp2_cdef->info[i].typ = 65535U;
                jp2->color.jp2_cdef->info[i].asoc = 65535U;
            }
        }
    }

    jp2->precedence = 0;    /* PRECEDENCE */
    jp2->approx = 0;        /* APPROX */

    jp2->jpip_on = parameters->jpip_on;

    return OPJ_TRUE;
}